

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::SetIsPrototype
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar3;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  DynamicObject *pDVar4;
  undefined4 *puVar5;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  bVar2 = DynamicTypeHandler::ChangeTypeOnProto();
  if ((bVar2) ||
     ((bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar2 &&
      (bVar2 = DynamicTypeHandler::IsolatePrototypes(), bVar2)))) {
    bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
    if ((bVar2) &&
       (ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&this->singletonInstance),
       *ppRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xb45,"(!GetIsShared() || this->singletonInstance == nullptr)",
                                  "!GetIsShared() || this->singletonInstance == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                        ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      pDVar4 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
      if (pDVar4 != instance) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xb46,
                                    "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    SetIsPrototype(this,instance,false);
  }
  else {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

        Assert(!GetIsShared() || this->singletonInstance == nullptr);
        Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);

        SetIsPrototype(instance, false);
    }